

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O0

wchar_t choose_attack_spell(bitflag *f,_Bool innate,_Bool non_innate)

{
  _Bool _Var1;
  uint32_t uVar2;
  long lVar3;
  wchar_t local_7c;
  byte abStack_78 [4];
  wchar_t i;
  uint8_t spells [92];
  wchar_t num;
  _Bool non_innate_local;
  _Bool innate_local;
  bitflag *f_local;
  
  for (local_7c = 0; local_7c < 0x5c; local_7c = local_7c + 1) {
    abStack_78[local_7c] = 0;
  }
  spells[0x58] = '\0';
  spells[0x59] = '\0';
  spells[0x5a] = '\0';
  spells[0x5b] = '\0';
  for (local_7c = L'\x01'; local_7c < L'\\'; local_7c = local_7c + L'\x01') {
    if ((((innate) || (_Var1 = mon_spell_is_innate(local_7c), !_Var1)) &&
        ((non_innate || (_Var1 = mon_spell_is_innate(local_7c), _Var1)))) &&
       (_Var1 = flag_has_dbg(f,0xc,local_7c,"f","i"), _Var1)) {
      lVar3 = (long)(int)spells._88_4_;
      spells._88_4_ = spells._88_4_ + 1;
      abStack_78[lVar3] = (byte)local_7c;
    }
  }
  uVar2 = Rand_div(spells._88_4_);
  return (wchar_t)abStack_78[(int)uVar2];
}

Assistant:

int choose_attack_spell(bitflag *f, bool innate, bool non_innate)
{
	int num = 0;
	uint8_t spells[RSF_MAX];

	int i;

	/* Paranoid initialization */
	for (i = 0; i < RSF_MAX; i++) {
		spells[i] = 0;
	}

	/* Extract spells, filtering as necessary */
	for (i = FLAG_START, num = 0; i < RSF_MAX; i++) {
		if (!innate && mon_spell_is_innate(i)) continue;
		if (!non_innate && !mon_spell_is_innate(i)) continue;
		if (rsf_has(f, i)) spells[num++] = i;
	}

	/* Pick at random */
	return (spells[randint0(num)]);
}